

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcols.c
# Opt level: O0

int ffgcls(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,int nultyp,
          char *nulval,char **array,char *nularray,int *anynul,int *status)

{
  float fVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  LONGLONG *array_00;
  size_t sVar6;
  ULONGLONG *array_01;
  ULONGLONG *ullarray;
  LONGLONG *llarray;
  double tscale;
  double *darray;
  float *earray;
  char local_378 [7];
  uchar byteval;
  char tmpnull [80];
  char *flgarray;
  char tmpstr [400];
  char dispfmt [20];
  char local_168 [8];
  char cform [20];
  char local_148 [8];
  char keyname [75];
  char *carray;
  char message [81];
  tcolumn *colptr;
  long jj;
  long ii;
  int local_70;
  int equivtype;
  int dlen;
  int ll;
  int nulwidth;
  int dwidth;
  int intcol;
  int scaled;
  int tstatus;
  int hdutype;
  int tcode;
  int nultyp_local;
  LONGLONG nelem_local;
  LONGLONG firstelem_local;
  LONGLONG firstrow_local;
  fitsfile *pfStack_28;
  int colnum_local;
  fitsfile *fptr_local;
  
  llarray = (LONGLONG *)0x3ff0000000000000;
  if ((*status < 1) && (nelem != 0)) {
    hdutype = nultyp;
    _tcode = nelem;
    nelem_local = firstelem;
    firstelem_local = firstrow;
    firstrow_local._4_4_ = colnum;
    pfStack_28 = fptr;
    if (fptr->HDUposition == fptr->Fptr->curhdu) {
      if ((fptr->Fptr->datastart == -1) && (iVar3 = ffrdef(fptr,status), 0 < iVar3)) {
        return *status;
      }
    }
    else {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    if (((int)firstrow_local._4_4_ < 1) || (pfStack_28->Fptr->tfield < (int)firstrow_local._4_4_)) {
      snprintf((char *)&carray,0x51,"Specified column number is out of range: %d",
               (ulong)firstrow_local._4_4_);
      ffpmsg((char *)&carray);
      *status = 0x12e;
      fptr_local._4_4_ = 0x12e;
    }
    else {
      ffeqtyll(pfStack_28,firstrow_local._4_4_,(int *)((long)&ii + 4),(LONGLONG *)0x0,
               (LONGLONG *)0x0,status);
      if ((ii._4_4_ < 0) && (ii._4_4_ < 1)) {
        ii._4_4_ = -ii._4_4_;
      }
      register0x00000000 = pfStack_28->Fptr->tableptr + (int)(firstrow_local._4_4_ - 1);
      tstatus = register0x00000000->tdatatype;
      if (tstatus < 1) {
        tstatus = -tstatus;
      }
      nulwidth = 0;
      if (tstatus == 0x10) {
        ffgcls2(pfStack_28,firstrow_local._4_4_,firstelem_local,nelem_local,_tcode,hdutype,nulval,
                array,nularray,anynul,status);
      }
      else if (tstatus == 0xe) {
        pcVar5 = (char *)malloc(_tcode);
        ffgcll(pfStack_28,firstrow_local._4_4_,firstelem_local,nelem_local,_tcode,hdutype,*nulval,
               pcVar5,nularray,anynul,status);
        if (*status < 1) {
          for (jj = 0; jj < (long)_tcode; jj = jj + 1) {
            if (pcVar5[jj] == '\x01') {
              strcpy(array[jj],"T");
            }
            else if (pcVar5[jj] == '\0') {
              strcpy(array[jj],"F");
            }
            else {
              strcpy(array[jj],"N");
            }
          }
        }
        free(pcVar5);
      }
      else if (tstatus == 0x53) {
        darray = (double *)calloc(_tcode << 1,4);
        ffgcle(pfStack_28,firstrow_local._4_4_,firstelem_local,(nelem_local + -1) * 2 + 1,
               _tcode << 1,1,1,-9.11912e-36,(float *)darray,nularray,anynul,status);
        if (*status < 1) {
          ffgcdw(pfStack_28,firstrow_local._4_4_,&ll,status);
          ll = (ll + -3) / 2;
          ffkeyn("TDISP",firstrow_local._4_4_,local_148,status);
          intcol = 0;
          local_168[0] = '\0';
          iVar3 = ffgkys(pfStack_28,local_148,tmpstr + 0x188,(char *)0x0,&intcol);
          if (iVar3 == 0) {
            ffcdsp(tmpstr + 0x188,local_168);
            if (tmpstr[0x188] == 'A') {
              local_168[0] = '\0';
            }
            else if (((((tmpstr[0x188] == 'I') || (tmpstr[0x188] == 'i')) || (tmpstr[0x188] == 'O'))
                     || ((tmpstr[0x188] == 'o' || (tmpstr[0x188] == 'Z')))) ||
                    (tmpstr[0x188] == 'z')) {
              nulwidth = 1;
            }
          }
          if (local_168[0] == '\0') {
            strcpy(local_168,"%14.6E");
          }
          colptr = (tcolumn *)0x0;
          for (jj = 0; jj < (long)_tcode; jj = jj + 1) {
            strcpy(array[jj],"(");
            fVar1 = *(float *)((long)darray + (long)colptr * 4);
            if ((fVar1 != -9.11912e-36) || (NAN(fVar1))) {
              if (nulwidth == 0) {
                snprintf((char *)&flgarray,400,local_168,
                         (double)*(float *)((long)darray + (long)colptr * 4));
              }
              else {
                snprintf((char *)&flgarray,400,local_168,
                         (ulong)(uint)(int)*(float *)((long)darray + (long)colptr * 4));
              }
            }
            else {
              strcpy((char *)&flgarray,"NULL");
              if (hdutype == 2) {
                nularray[jj] = '\x01';
              }
            }
            strncat(array[jj],(char *)&flgarray,(long)ll);
            strcat(array[jj],",");
            pcVar5 = colptr->ttype + 1;
            fVar1 = *(float *)((long)darray + (long)pcVar5 * 4);
            if ((fVar1 != -9.11912e-36) || (NAN(fVar1))) {
              if (nulwidth == 0) {
                snprintf((char *)&flgarray,400,local_168,
                         (double)*(float *)((long)darray + (long)pcVar5 * 4));
              }
              else {
                snprintf((char *)&flgarray,400,local_168,
                         (ulong)(uint)(int)*(float *)((long)darray + (long)pcVar5 * 4));
              }
            }
            else {
              strcpy((char *)&flgarray,"NULL");
              if (hdutype == 2) {
                nularray[jj] = '\x01';
              }
            }
            strncat(array[jj],(char *)&flgarray,(long)ll);
            strcat(array[jj],")");
            colptr = (tcolumn *)(colptr->ttype + 2);
          }
        }
        free(darray);
      }
      else if (tstatus == 0xa3) {
        tscale = (double)calloc(_tcode << 1,8);
        ffgcld(pfStack_28,firstrow_local._4_4_,firstelem_local,(nelem_local + -1) * 2 + 1,
               _tcode << 1,1,1,-9.1191291391491e-36,(double *)tscale,nularray,anynul,status);
        if (*status < 1) {
          ffgcdw(pfStack_28,firstrow_local._4_4_,&ll,status);
          ll = (ll + -3) / 2;
          ffkeyn("TDISP",firstrow_local._4_4_,local_148,status);
          intcol = 0;
          local_168[0] = '\0';
          iVar3 = ffgkys(pfStack_28,local_148,tmpstr + 0x188,(char *)0x0,&intcol);
          if (iVar3 == 0) {
            ffcdsp(tmpstr + 0x188,local_168);
            if (tmpstr[0x188] == 'A') {
              local_168[0] = '\0';
            }
            else if (((tmpstr[0x188] == 'I') || (tmpstr[0x188] == 'i')) ||
                    ((tmpstr[0x188] == 'O' ||
                     (((tmpstr[0x188] == 'o' || (tmpstr[0x188] == 'Z')) || (tmpstr[0x188] == 'z'))))
                    )) {
              nulwidth = 1;
            }
          }
          if (local_168[0] == '\0') {
            strcpy(local_168,"%23.15E");
          }
          colptr = (tcolumn *)0x0;
          for (jj = 0; jj < (long)_tcode; jj = jj + 1) {
            strcpy(array[jj],"(");
            dVar2 = *(double *)((long)tscale + (long)colptr * 8);
            if ((dVar2 != -9.1191291391491e-36) || (NAN(dVar2))) {
              if (nulwidth == 0) {
                snprintf((char *)&flgarray,400,local_168,
                         *(undefined8 *)((long)tscale + (long)colptr * 8));
              }
              else {
                snprintf((char *)&flgarray,400,local_168,
                         (ulong)(uint)(int)*(double *)((long)tscale + (long)colptr * 8));
              }
            }
            else {
              strcpy((char *)&flgarray,"NULL");
              if (hdutype == 2) {
                nularray[jj] = '\x01';
              }
            }
            strncat(array[jj],(char *)&flgarray,(long)ll);
            strcat(array[jj],",");
            pcVar5 = colptr->ttype + 1;
            dVar2 = *(double *)((long)tscale + (long)pcVar5 * 8);
            if ((dVar2 != -9.1191291391491e-36) || (NAN(dVar2))) {
              if (nulwidth == 0) {
                snprintf((char *)&flgarray,400,local_168,
                         *(undefined8 *)((long)tscale + (long)pcVar5 * 8));
              }
              else {
                snprintf((char *)&flgarray,400,local_168,
                         (ulong)(uint)(int)*(double *)((long)tscale + (long)pcVar5 * 8));
              }
            }
            else {
              strcpy((char *)&flgarray,"NULL");
              if (hdutype == 2) {
                nularray[jj] = '\x01';
              }
            }
            strncat(array[jj],(char *)&flgarray,(long)ll);
            strcat(array[jj],")");
            colptr = (tcolumn *)(colptr->ttype + 2);
          }
        }
        free((void *)tscale);
      }
      else if ((tstatus == 0x51) && (ii._4_4_ == 0x51)) {
        array_00 = (LONGLONG *)calloc(_tcode,8);
        pcVar5 = (char *)calloc(_tcode,1);
        ll = 0x14;
        iVar3 = ffgcfjj(pfStack_28,firstrow_local._4_4_,firstelem_local,nelem_local,_tcode,array_00,
                        pcVar5,anynul,status);
        if (0 < iVar3) {
          free(pcVar5);
          free(array_00);
          return *status;
        }
        if (nulval == (char *)0x0) {
          strcpy(local_378," ");
          dlen = 1;
        }
        else {
          strncpy(local_378,nulval,0x4f);
          tmpnull[0x47] = '\0';
          sVar6 = strlen(local_378);
          dlen = (int)sVar6;
        }
        for (jj = 0; jj < (long)_tcode; jj = jj + 1) {
          if (pcVar5[jj] == '\0') {
            snprintf((char *)&flgarray,400,"%20lld",array_00[jj]);
            *array[jj] = '\0';
            strncat(array[jj],(char *)&flgarray,0x14);
          }
          else {
            *array[jj] = '\0';
            if (ll < dlen) {
              strncat(array[jj],local_378,(long)ll);
            }
            else {
              sprintf(array[jj],"%*s",(ulong)(uint)ll,local_378);
            }
            if (hdutype == 2) {
              nularray[jj] = '\x01';
            }
          }
        }
        free(pcVar5);
        free(array_00);
      }
      else if ((tstatus == 0x51) && (ii._4_4_ == 0x50)) {
        array_01 = (ULONGLONG *)calloc(_tcode,8);
        pcVar5 = (char *)calloc(_tcode,1);
        ll = 0x14;
        iVar3 = ffgcfujj(pfStack_28,firstrow_local._4_4_,firstelem_local,nelem_local,_tcode,array_01
                         ,pcVar5,anynul,status);
        if (0 < iVar3) {
          free(pcVar5);
          free(array_01);
          return *status;
        }
        if (nulval == (char *)0x0) {
          strcpy(local_378," ");
          dlen = 1;
        }
        else {
          strncpy(local_378,nulval,0x4f);
          tmpnull[0x47] = '\0';
          sVar6 = strlen(local_378);
          dlen = (int)sVar6;
        }
        for (jj = 0; jj < (long)_tcode; jj = jj + 1) {
          if (pcVar5[jj] == '\0') {
            snprintf((char *)&flgarray,400,"%20llu",array_01[jj]);
            *array[jj] = '\0';
            strncat(array[jj],(char *)&flgarray,0x14);
          }
          else {
            *array[jj] = '\0';
            if (ll < dlen) {
              strncat(array[jj],local_378,(long)ll);
            }
            else {
              sprintf(array[jj],"%*s",(ulong)(uint)ll,local_378);
            }
            if (hdutype == 2) {
              nularray[jj] = '\x01';
            }
          }
        }
        free(pcVar5);
        free(array_01);
      }
      else {
        tscale = (double)calloc(_tcode,8);
        iVar3 = ffgcld(pfStack_28,firstrow_local._4_4_,firstelem_local,nelem_local,_tcode,1,hdutype,
                       -9.1191291391491e-36,(double *)tscale,nularray,anynul,status);
        if (0 < iVar3) {
          free((void *)tscale);
          return *status;
        }
        ffgcdw(pfStack_28,firstrow_local._4_4_,&ll,status);
        ffkeyn("TSCAL",firstrow_local._4_4_,local_148,status);
        intcol = 0;
        dwidth = 0;
        iVar3 = ffgkyd(pfStack_28,local_148,(double *)&llarray,(char *)0x0,&intcol);
        if ((iVar3 == 0) && (((double)llarray != 1.0 || (NAN((double)llarray))))) {
          dwidth = 1;
        }
        nulwidth = 0;
        if ((tstatus < 0x2a) && (dwidth == 0)) {
          nulwidth = 1;
        }
        ffkeyn("TDISP",firstrow_local._4_4_,local_148,status);
        intcol = 0;
        local_168[0] = '\0';
        iVar3 = ffgkys(pfStack_28,local_148,tmpstr + 0x188,(char *)0x0,&intcol);
        if (iVar3 == 0) {
          ffcdsp(tmpstr + 0x188,local_168);
          if (tmpstr[0x188] == 'A') {
            local_168[0] = '\0';
          }
          else if (((((tmpstr[0x188] == 'I') || (tmpstr[0x188] == 'i')) || (tmpstr[0x188] == 'O'))
                   || ((tmpstr[0x188] == 'o' || (tmpstr[0x188] == 'Z')))) || (tmpstr[0x188] == 'z'))
          {
            nulwidth = 1;
          }
        }
        if (local_168[0] == '\0') {
          ffkeyn("TFORM",firstrow_local._4_4_,local_148,status);
          ffgkys(pfStack_28,local_148,tmpstr + 0x188,(char *)0x0,status);
          if ((dwidth == 0) || (0x15 < tstatus)) {
            if ((dwidth == 0) || (tstatus != 0x29)) {
              if ((dwidth == 0) || (tstatus != 0x51)) {
                ffghdt(pfStack_28,&scaled,status);
                if (scaled == 1) {
                  ffcdsp(tmpstr + 0x188,local_168);
                }
                else if (tstatus == 1) {
                  strcpy(local_168,"%4d");
                }
                else if (tstatus == 0xb) {
                  strcpy(local_168,"%4d");
                }
                else if (tstatus == 0x15) {
                  strcpy(local_168,"%6d");
                }
                else if (tstatus == 0x29) {
                  strcpy(local_168,"%11.0f");
                  nulwidth = 0;
                }
                else if (tstatus == 0x2a) {
                  strcpy(local_168,"%#14.6G");
                }
                else if (tstatus == 0x52) {
                  strcpy(local_168,"%#23.15G");
                }
              }
              else {
                strcpy(local_168,"%#23.15G");
              }
            }
            else {
              strcpy(local_168,"%#23.15G");
            }
          }
          else {
            strcpy(local_168,"%#14.6G");
          }
        }
        if (nulval == (char *)0x0) {
          strcpy(local_378," ");
          dlen = 1;
        }
        else {
          strncpy(local_378,nulval,0x4f);
          tmpnull[0x47] = '\0';
          sVar6 = strlen(local_378);
          dlen = (int)sVar6;
        }
        for (jj = 0; jj < (long)_tcode; jj = jj + 1) {
          if (tstatus == 1) {
            uVar4 = (uint)*(double *)((long)tscale + jj * 8);
            earray._7_1_ = (undefined1)uVar4;
            for (equivtype = 0; equivtype < 8; equivtype = equivtype + 1) {
              if ((int)((uVar4 & 0xff) << ((byte)equivtype & 0x1f) & 0xff) >> 7 == 0) {
                array[jj][equivtype] = '0';
              }
              else {
                array[jj][equivtype] = '1';
              }
            }
            array[jj][8] = '\0';
          }
          else if ((((hdutype == 1) &&
                    (dVar2 = *(double *)((long)tscale + jj * 8), dVar2 == -9.1191291391491e-36)) &&
                   (!NAN(dVar2))) || ((hdutype == 2 && (nularray[jj] != '\0')))) {
            *array[jj] = '\0';
            if (ll < dlen) {
              strncat(array[jj],local_378,(long)ll);
            }
            else {
              sprintf(array[jj],"%*s",(ulong)(uint)ll,local_378);
            }
          }
          else {
            if (nulwidth == 0) {
              snprintf((char *)&flgarray,400,local_168,*(undefined8 *)((long)tscale + jj * 8));
            }
            else {
              snprintf((char *)&flgarray,400,local_168,
                       (ulong)(uint)(int)*(double *)((long)tscale + jj * 8));
            }
            sVar6 = strlen((char *)&flgarray);
            local_70 = (int)sVar6;
            if (ll < local_70) {
              memset(&flgarray,0x2a,(long)ll);
            }
            *array[jj] = '\0';
            strncat(array[jj],(char *)&flgarray,(long)ll);
          }
        }
        free((void *)tscale);
      }
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgcls( fitsfile *fptr,   /* I - FITS file pointer                       */
            int  colnum,      /* I - number of column to read (1 = 1st col) */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)        */
            LONGLONG  firstelem,  /* I - first vector element to read (1 = 1st) */
            LONGLONG  nelem,      /* I - number of strings to read              */
            int   nultyp,     /* I - null value handling code:               */
                              /*     1: set undefined pixels = nulval        */
                              /*     2: set nularray=1 for undefined pixels  */
            char  *nulval,    /* I - value for null pixels if nultyp = 1     */
            char **array,     /* O - array of values that are read           */
            char *nularray,   /* O - array of flags = 1 if nultyp = 2        */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of string values from a column in the current FITS HDU.
  Returns a formated string value, regardless of the datatype of the column
*/
{
    int tcode, hdutype, tstatus, scaled, intcol, dwidth, nulwidth, ll, dlen;
    int equivtype;
    long ii, jj;
    tcolumn *colptr;
    char message[FLEN_ERRMSG], *carray, keyname[FLEN_KEYWORD];
    char cform[20], dispfmt[20], tmpstr[400], *flgarray, tmpnull[80];
    unsigned char byteval;
    float *earray;
    double *darray, tscale = 1.0;
    LONGLONG *llarray;
    ULONGLONG *ullarray;

    if (*status > 0 || nelem == 0)  /* inherit input status value if > 0 */
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
    {
        snprintf(message, FLEN_ERRMSG,"Specified column number is out of range: %d",
                colnum);
        ffpmsg(message);
        return(*status = BAD_COL_NUM);
    }

    /* get equivalent dataype of column (only needed for TLONGLONG columns) */
    ffeqtyll(fptr, colnum, &equivtype, NULL, NULL, status);
    if (equivtype < 0) equivtype = abs(equivtype);
    
    colptr  = (fptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */
    tcode = abs(colptr->tdatatype);

    intcol = 0;
    if (tcode == TSTRING)
    {
      /* simply call the string column reading routine */
      ffgcls2(fptr, colnum, firstrow, firstelem, nelem, nultyp, nulval,
           array, nularray, anynul, status);
    }
    else if (tcode == TLOGICAL)
    {
      /* allocate memory for the array of logical values */
      carray = (char *) malloc((size_t) nelem);

      /*  call the logical column reading routine */
      ffgcll(fptr, colnum, firstrow, firstelem, nelem, nultyp, *nulval,
           carray, nularray, anynul, status); 

      if (*status <= 0)
      {
         /* convert logical values to "T", "F", or "N" (Null) */
         for (ii = 0; ii < nelem; ii++)
         {
           if (carray[ii] == 1)
              strcpy(array[ii], "T");
           else if (carray[ii] == 0)
              strcpy(array[ii], "F");
           else  /* undefined values = 2 */
              strcpy(array[ii],"N");
         }
      }

      free(carray);  /* free the memory */
    }
    else if (tcode == TCOMPLEX)
    {
      /* allocate memory for the array of double values */
      earray = (float *) calloc((size_t) (nelem * 2), sizeof(float) );
      
      ffgcle(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2,
        1, 1, FLOATNULLVALUE, earray, nularray, anynul, status);

      if (*status <= 0)
      {

         /* determine the format for the output strings */

         ffgcdw(fptr, colnum, &dwidth, status);
         dwidth = (dwidth - 3) / 2;
 
         /* use the TDISPn keyword if it exists */
         ffkeyn("TDISP", colnum, keyname, status);
         tstatus = 0;
         cform[0] = '\0';

         if (ffgkys(fptr, keyname, dispfmt, NULL, &tstatus) == 0)
         {
             /* convert the Fortran style format to a C style format */
             ffcdsp(dispfmt, cform);

	     /* Special case: TDISPn='Aw' disallowed for numeric types */
	     if (dispfmt[0] == 'A') {
	       cform[0] = 0;

	       /* Special case: if the output is intended to be represented
		  as an integer, but we read it as a double, we need to
		  set intcol = 1 so it is printed as an integer */
	     } else if ((dispfmt[0] == 'I') || (dispfmt[0] == 'i') ||
			(dispfmt[0] == 'O') || (dispfmt[0] == 'o') ||
			(dispfmt[0] == 'Z') || (dispfmt[0] == 'z')) {
	       intcol = 1;
	     }
         }

         if (!cform[0])
             strcpy(cform, "%14.6E");

         /* write the formated string for each value:  "(real,imag)" */
         jj = 0;
         for (ii = 0; ii < nelem; ii++)
         {
           strcpy(array[ii], "(");

           /* test for null value */
           if (earray[jj] == FLOATNULLVALUE)
           {
             strcpy(tmpstr, "NULL");
             if (nultyp == 2)
                nularray[ii] = 1;
           }
           else if (intcol)
	   {
	       snprintf(tmpstr, 400,cform, (int) earray[jj]);
	   } 
	   else 
	   {
	       snprintf(tmpstr, 400,cform, earray[jj]);
	   }

           strncat(array[ii], tmpstr, dwidth);
           strcat(array[ii], ",");
           jj++;

           /* test for null value */
           if (earray[jj] == FLOATNULLVALUE)
           {
             strcpy(tmpstr, "NULL");
             if (nultyp == 2)
                nularray[ii] = 1;
           }
           else if (intcol)
	   {
	       snprintf(tmpstr, 400,cform, (int) earray[jj]);
	   } 
	   else 
	   {
	       snprintf(tmpstr, 400,cform, earray[jj]);
	   }

           strncat(array[ii], tmpstr, dwidth);
           strcat(array[ii], ")");
           jj++;
         }
      }

      free(earray);  /* free the memory */
    }
    else if (tcode == TDBLCOMPLEX)
    {
      /* allocate memory for the array of double values */
      darray = (double *) calloc((size_t) (nelem * 2), sizeof(double) );
      
      ffgcld(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2,
        1, 1, DOUBLENULLVALUE, darray, nularray, anynul, status);

      if (*status <= 0)
      {
         /* determine the format for the output strings */

         ffgcdw(fptr, colnum, &dwidth, status);
         dwidth = (dwidth - 3) / 2;

         /* use the TDISPn keyword if it exists */
         ffkeyn("TDISP", colnum, keyname, status);
         tstatus = 0;
         cform[0] = '\0';
 
         if (ffgkys(fptr, keyname, dispfmt, NULL, &tstatus) == 0)
         {
             /* convert the Fortran style format to a C style format */
             ffcdsp(dispfmt, cform);

	     /* Special case: TDISPn='Aw' disallowed for numeric types */
	     if (dispfmt[0] == 'A') {
	       cform[0] = 0;

	       /* Special case: if the output is intended to be represented
		  as an integer, but we read it as a double, we need to
		  set intcol = 1 so it is printed as an integer */
	     } else if ((dispfmt[0] == 'I') || (dispfmt[0] == 'i') ||
			(dispfmt[0] == 'O') || (dispfmt[0] == 'o') ||
			(dispfmt[0] == 'Z') || (dispfmt[0] == 'z')) {
	       intcol = 1;
	     }
         }

         if (!cform[0])
            strcpy(cform, "%23.15E");

         /* write the formated string for each value:  "(real,imag)" */
         jj = 0;
         for (ii = 0; ii < nelem; ii++)
         {
           strcpy(array[ii], "(");

           /* test for null value */
           if (darray[jj] == DOUBLENULLVALUE)
           {
             strcpy(tmpstr, "NULL");
             if (nultyp == 2)
                nularray[ii] = 1;
           }
           else if (intcol)
	   {
	       snprintf(tmpstr, 400,cform, (int) darray[jj]);
	   } 
	   else 
	   {
	       snprintf(tmpstr, 400,cform, darray[jj]);
	   }

           strncat(array[ii], tmpstr, dwidth);
           strcat(array[ii], ",");
           jj++;

           /* test for null value */
           if (darray[jj] == DOUBLENULLVALUE)
           {
             strcpy(tmpstr, "NULL");
             if (nultyp == 2)
                nularray[ii] = 1;
           }
           else if (intcol)
	   {
	       snprintf(tmpstr, 400,cform, (int) darray[jj]);
	   } 
	   else 
	   {
	       snprintf(tmpstr, 400,cform, darray[jj]);
	   }

           strncat(array[ii], tmpstr, dwidth);
           strcat(array[ii], ")");
           jj++;
         }
      }

      free(darray);  /* free the memory */
    }
    else if (tcode == TLONGLONG && equivtype == TLONGLONG)
    {
      /* allocate memory for the array of LONGLONG values */
      llarray = (LONGLONG *) calloc((size_t) nelem, sizeof(LONGLONG) );
      flgarray = (char *) calloc((size_t) nelem, sizeof(char) );
      dwidth = 20;  /* max width of displayed long long integer value */

      if (ffgcfjj(fptr, colnum, firstrow, firstelem, nelem,
            llarray, flgarray, anynul, status) > 0)
      {
         free(flgarray);
         free(llarray);
         return(*status);
      }

      /* write the formated string for each value */
      if (nulval) {
          strncpy(tmpnull, nulval,79);
          tmpnull[79]='\0'; /* In case len(nulval) >= 79 */
          nulwidth = strlen(tmpnull);
      } else {
          strcpy(tmpnull, " ");
          nulwidth = 1;
      }

      for (ii = 0; ii < nelem; ii++)
      {
           if ( flgarray[ii] )
           {
              *array[ii] = '\0';
              if (dwidth < nulwidth)
                  strncat(array[ii], tmpnull, dwidth);
              else
                  sprintf(array[ii],"%*s",dwidth,tmpnull);
		  
              if (nultyp == 2)
	          nularray[ii] = 1;
           }
           else
           {	   

#if defined(_MSC_VER)
    /* Microsoft Visual C++ 6.0 uses '%I64d' syntax  for 8-byte integers */
        snprintf(tmpstr, 400,"%20I64d", llarray[ii]);
#elif (USE_LL_SUFFIX == 1)
        snprintf(tmpstr, 400,"%20lld", llarray[ii]);
#else
        snprintf(tmpstr, 400,"%20ld", llarray[ii]);
#endif
              *array[ii] = '\0';
              strncat(array[ii], tmpstr, 20);
           }
      }

      free(flgarray);
      free(llarray);  /* free the memory */

    }
    else if (tcode == TLONGLONG && equivtype == TULONGLONG)
    {
      /* allocate memory for the array of ULONGLONG values */
      ullarray = (ULONGLONG *) calloc((size_t) nelem, sizeof(ULONGLONG) );
      flgarray = (char *) calloc((size_t) nelem, sizeof(char) );
      dwidth = 20;  /* max width of displayed unsigned long long integer value */

      if (ffgcfujj(fptr, colnum, firstrow, firstelem, nelem,
            ullarray, flgarray, anynul, status) > 0)
      {
         free(flgarray);
         free(ullarray);
         return(*status);
      }

      /* write the formated string for each value */
      if (nulval) {
          strncpy(tmpnull, nulval, 79);
          tmpnull[79]='\0'; /* In case len(nulval) >= 79 */
          nulwidth = strlen(tmpnull);
      } else {
          strcpy(tmpnull, " ");
          nulwidth = 1;
      }

      for (ii = 0; ii < nelem; ii++)
      {
           if ( flgarray[ii] )
           {
              *array[ii] = '\0';
              if (dwidth < nulwidth)
                  strncat(array[ii], tmpnull, dwidth);
              else
                  sprintf(array[ii],"%*s",dwidth,tmpnull);
		  
              if (nultyp == 2)
	          nularray[ii] = 1;
           }
           else
           {	   

#if defined(_MSC_VER)
    /* Microsoft Visual C++ 6.0 uses '%I64d' syntax  for 8-byte integers */
        snprintf(tmpstr, 400, "%20I64u", ullarray[ii]); 
#elif (USE_LL_SUFFIX == 1)
        snprintf(tmpstr, 400, "%20llu", ullarray[ii]);
#else
        snprintf(tmpstr, 400, "%20lu", ullarray[ii]);
#endif
              *array[ii] = '\0';
              strncat(array[ii], tmpstr, 20);
           }
      }

      free(flgarray);
      free(ullarray);  /* free the memory */

    }
    else
    {
      /* allocate memory for the array of double values */
      darray = (double *) calloc((size_t) nelem, sizeof(double) );
      
      /* read all other numeric type columns as doubles */
      if (ffgcld(fptr, colnum, firstrow, firstelem, nelem, 1, nultyp, 
           DOUBLENULLVALUE, darray, nularray, anynul, status) > 0)
      {
         free(darray);
         return(*status);
      }

      /* determine the format for the output strings */

      ffgcdw(fptr, colnum, &dwidth, status);

      /* check if  column is scaled */
      ffkeyn("TSCAL", colnum, keyname, status);
      tstatus = 0;
      scaled = 0;
      if (ffgkyd(fptr, keyname, &tscale, NULL, &tstatus) == 0)
      {
            if (tscale != 1.0)
                scaled = 1;    /* yes, this is a scaled column */
      }

      intcol = 0;
      if (tcode <= TLONG && !scaled)
             intcol = 1;   /* this is an unscaled integer column */

      /* use the TDISPn keyword if it exists */
      ffkeyn("TDISP", colnum, keyname, status);
      tstatus = 0;
      cform[0] = '\0';

      if (ffgkys(fptr, keyname, dispfmt, NULL, &tstatus) == 0)
      {
           /* convert the Fortran style TDISPn to a C style format */
           ffcdsp(dispfmt, cform);

	   /* Special case: TDISPn='Aw' disallowed for numeric types */
	   if (dispfmt[0] == 'A') {
	     cform[0] = 0;

	   /* Special case: if the output is intended to be represented
	      as an integer, but we read it as a double, we need to
	      set intcol = 1 so it is printed as an integer */
	   } else if ((dispfmt[0] == 'I') || (dispfmt[0] == 'i') ||
		      (dispfmt[0] == 'O') || (dispfmt[0] == 'o') ||
		      (dispfmt[0] == 'Z') || (dispfmt[0] == 'z')) {
	     intcol = 1;
	   }
      }

      if (!cform[0])
      {
            /* no TDISPn keyword; use TFORMn instead */

            ffkeyn("TFORM", colnum, keyname, status);
            ffgkys(fptr, keyname, dispfmt, NULL, status);

            if (scaled && tcode <= TSHORT)
            {
                  /* scaled short integer column == float */
                  strcpy(cform, "%#14.6G");
            }
            else if (scaled && tcode == TLONG)
            {
                  /* scaled long integer column == double */
                  strcpy(cform, "%#23.15G");
            }
            else if (scaled && tcode == TLONGLONG)
            {
                  /* scaled long long integer column == double */
                  strcpy(cform, "%#23.15G");
            }
            else
            {
               ffghdt(fptr, &hdutype, status);
               if (hdutype == ASCII_TBL)
               {
                  /* convert the Fortran style TFORMn to a C style format */
                  ffcdsp(dispfmt, cform);
               }
               else
               {
                 /* this is a binary table, need to convert the format */
                  if (tcode == TBIT) {            /* 'X' */
                     strcpy(cform, "%4d");
                  } else if (tcode == TBYTE) {    /* 'B' */
                     strcpy(cform, "%4d");
                  } else if (tcode == TSHORT) {   /* 'I' */
                     strcpy(cform, "%6d");
                  } else if (tcode == TLONG) {    /* 'J' */
                     strcpy(cform, "%11.0f");
                     intcol = 0;  /* needed to support unsigned int */
                  } else if (tcode == TFLOAT) {   /* 'E' */
                     strcpy(cform, "%#14.6G");
                  } else if (tcode == TDOUBLE) {  /* 'D' */
                     strcpy(cform, "%#23.15G");
                  }
               }
            }
      } 

      if (nulval) {
          strncpy(tmpnull, nulval,79);
          tmpnull[79]='\0';
          nulwidth = strlen(tmpnull);
      } else {
          strcpy(tmpnull, " ");
          nulwidth = 1;
      }

      /* write the formated string for each value */
      for (ii = 0; ii < nelem; ii++)
      {
           if (tcode == TBIT)
           {
               byteval = (unsigned char) darray[ii];

               for (ll=0; ll < 8; ll++)
               {
                   if ( ((unsigned char) (byteval << ll)) >> 7 )
                       *(array[ii] + ll) = '1';
                   else
                       *(array[ii] + ll) = '0';
               }
               *(array[ii] + 8) = '\0';
           }
           /* test for null value */
           else if ( (nultyp == 1 && darray[ii] == DOUBLENULLVALUE) ||
                (nultyp == 2 && nularray[ii]) )
           {
              *array[ii] = '\0';
              if (dwidth < nulwidth)
                  strncat(array[ii], tmpnull, dwidth);
              else
                  sprintf(array[ii],"%*s",dwidth,tmpnull);
           }
           else
           {	   
              if (intcol) {
                snprintf(tmpstr, 400,cform, (int) darray[ii]);
              } else {
                snprintf(tmpstr, 400,cform, darray[ii]);
              }
	      
              /* fill field with '*' if number is too wide */
              dlen = strlen(tmpstr);
	      if (dlen > dwidth) {
	         memset(tmpstr, '*', dwidth);
              }

              *array[ii] = '\0';
              strncat(array[ii], tmpstr, dwidth);
           }
      }

      free(darray);  /* free the memory */
    }
    return(*status);
}